

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O3

void __thiscall
units::detail::unit_data::unit_data
          (unit_data *this,int meters,int kilograms,int seconds,int amperes,int kelvins,int moles,
          int candelas,int currencys,int counts,int radians,uint per_unit,uint iflag,uint eflag,
          uint equation)

{
  *this = (unit_data)
          ((eflag & 1) << 0x1e | (iflag & 1) << 0x1d | (per_unit & 1) << 0x1c |
           (counts & 3U) << 0x1a | (currencys & 3U) << 0x18 | (radians & 7U) << 0x15 |
           (moles & 3U) << 0x13 |
           (kelvins & 7U) << 0x10 |
           (amperes & 7U) << 0xb | (kilograms & 7U) << 8 | meters & 0xfU | (seconds & 0xfU) << 4 |
           (candelas & 3U) << 0xe | equation << 0x1f);
  return;
}

Assistant:

constexpr unit_data(
            int meters,
            int kilograms,
            int seconds,
            int amperes,
            int kelvins,
            int moles,
            int candelas,
            int currencys,
            int counts,
            int radians,
            unsigned int per_unit,
            unsigned int iflag,
            unsigned int eflag,
            unsigned int equation) :
            meter_(meters), second_(seconds), kilogram_(kilograms),
            ampere_(amperes), candela_(candelas), kelvin_(kelvins),
            mole_(moles), radians_(radians), currency_(currencys),
            count_(counts), per_unit_(per_unit), i_flag_(iflag), e_flag_(eflag),
            equation_(equation)
        {
        }